

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  size_type __len1;
  XMLError error;
  size_t sVar2;
  ostream *poVar3;
  int iVar4;
  long lVar5;
  string filename;
  VideoHppGenerator generator;
  XMLDocument doc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  VideoHppGenerator local_490;
  XMLDocument local_338;
  
  if ((argc & 1U) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"VideoHppGenerator usage: VideoHppGenerator [-f filename]",0x38
              );
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tdefault for filename is <",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/Vulkan-Headers/registry/video.xml"
               ,0x6d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    iVar4 = -1;
  }
  else {
    local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4b0,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/Vulkan-Headers/registry/video.xml"
               ,"");
    if (1 < argc) {
      lVar5 = 1;
      do {
        __len1 = local_4b0._M_string_length;
        pcVar1 = argv[lVar5];
        if (((*pcVar1 != '-') || (pcVar1[1] != 'f')) || (pcVar1[2] != '\0')) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"unsupported argument <",0x16);
          pcVar1 = argv[lVar5];
          if (pcVar1 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x14c208);
          }
          else {
            sVar2 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">",1);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
          std::ostream::put('\b');
          iVar4 = -1;
          std::ostream::flush();
          goto LAB_00116548;
        }
        pcVar1 = argv[lVar5 + 1];
        sVar2 = strlen(pcVar1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_4b0,0,__len1,pcVar1,sVar2);
        lVar5 = lVar5 + 2;
      } while ((int)lVar5 < argc);
    }
    tinyxml2::XMLDocument::XMLDocument(&local_338,true,PRESERVE_WHITESPACE);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"VideoHppGenerator: Loading ",0x1b);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_4b0._M_dataplus._M_p,local_4b0._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    error = tinyxml2::XMLDocument::LoadFile(&local_338,local_4b0._M_dataplus._M_p);
    if (error == XML_SUCCESS) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"VideoHppGenerator: Parsing ",0x1b);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_4b0._M_dataplus._M_p,
                          local_4b0._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      VideoHppGenerator::VideoHppGenerator(&local_490,&local_338);
      VideoHppGenerator::generateHppFile(&local_490);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "VideoHppGenerator: could not find clang-format. The generated files will not be formatted accordingly.\n"
                 ,0x67);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
      ::~_Rb_tree(&local_490.m_types._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>_>_>
      ::~_Rb_tree(&local_490.m_structs._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IncludeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IncludeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IncludeData>_>_>
      ::~_Rb_tree(&local_490.m_includes._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ExternalTypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ExternalTypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ExternalTypeData>_>_>
      ::~_Rb_tree(&local_490.m_externalTypes._M_t);
      std::
      vector<VideoHppGenerator::ExtensionData,_std::allocator<VideoHppGenerator::ExtensionData>_>::
      ~vector(&local_490.m_extensions);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>_>
      ::~_Rb_tree(&local_490.m_enums._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::DefineData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::DefineData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::DefineData>_>_>
      ::~_Rb_tree(&local_490.m_defines._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490.m_copyrightMessage._M_dataplus._M_p != &local_490.m_copyrightMessage.field_2)
      {
        operator_delete(local_490.m_copyrightMessage._M_dataplus._M_p,
                        local_490.m_copyrightMessage.field_2._M_allocated_capacity + 1);
      }
      iVar4 = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"VideoHppGenerator: failed to load file ",0x27);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_4b0._M_dataplus._M_p,
                          local_4b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," with error <",0xd);
      toString_abi_cxx11_(&local_490.m_copyrightMessage,error);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_490.m_copyrightMessage._M_dataplus._M_p,
                          local_490.m_copyrightMessage._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,">",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490.m_copyrightMessage._M_dataplus._M_p != &local_490.m_copyrightMessage.field_2)
      {
        operator_delete(local_490.m_copyrightMessage._M_dataplus._M_p,
                        local_490.m_copyrightMessage.field_2._M_allocated_capacity + 1);
      }
      iVar4 = -1;
    }
    tinyxml2::XMLDocument::~XMLDocument(&local_338);
LAB_00116548:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar4;
}

Assistant:

int main( int argc, char ** argv )
{
  if ( ( argc % 2 ) == 0 )
  {
    std::cout << "VideoHppGenerator usage: VideoHppGenerator [-f filename]" << std::endl;
    std::cout << "\tdefault for filename is <" << VIDEO_SPEC << ">" << std::endl;
    return -1;
  }

  std::string filename = VIDEO_SPEC;
  for ( int i = 1; i < argc; i += 2 )
  {
    if ( strcmp( argv[i], "-f" ) == 0 )
    {
      filename = argv[i + 1];
    }
    else
    {
      std::cout << "unsupported argument <" << argv[i] << ">" << std::endl;
      return -1;
    }
  }

#if defined( CLANG_FORMAT_EXECUTABLE )
  std::cout << "VideoHppGenerator: Found ";
  std::string commandString = "\"" CLANG_FORMAT_EXECUTABLE "\" --version ";
  int         ret           = std::system( commandString.c_str() );
  if ( ret != 0 )
  {
    std::cout << "VideoHppGenerator: failed to determine clang_format version with error <" << ret << ">\n";
  }
#endif

  tinyxml2::XMLDocument doc;
  std::cout << "VideoHppGenerator: Loading " << filename << std::endl;
  tinyxml2::XMLError error = doc.LoadFile( filename.c_str() );
  if ( error != tinyxml2::XML_SUCCESS )
  {
    std::cout << "VideoHppGenerator: failed to load file " << filename << " with error <" << toString( error ) << ">" << std::endl;
    return -1;
  }

  try
  {
    std::cout << "VideoHppGenerator: Parsing " << filename << std::endl;
    VideoHppGenerator generator( doc );

    generator.generateHppFile();

#if !defined( CLANG_FORMAT_EXECUTABLE )
    std::cout << "VideoHppGenerator: could not find clang-format. The generated files will not be formatted accordingly.\n";
#endif
  }
  catch ( std::exception const & e )
  {
    std::cout << "caught exception: " << e.what() << std::endl;
    return -1;
  }
  catch ( ... )
  {
    std::cout << "caught unknown exception" << std::endl;
    return -1;
  }
  return 0;
}